

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O3

bool __thiscall cmStdIoConnection::OnConnectionShuttingDown(cmStdIoConnection *this)

{
  uv_stream_ptr *this_00;
  uv_stream_s *puVar1;
  
  this_00 = &this->ReadStream;
  puVar1 = ::cm::uv_handle_ptr_base_<uv_stream_s>::get
                     (&this_00->super_uv_handle_ptr_base_<uv_stream_s>);
  if (puVar1 != (uv_stream_s *)0x0) {
    puVar1 = ::cm::uv_handle_ptr_::operator_cast_to_uv_stream_s_(this_00);
    uv_read_stop(puVar1);
    puVar1 = ::cm::uv_handle_ptr_base_<uv_stream_s>::operator->
                       (&this_00->super_uv_handle_ptr_base_<uv_stream_s>);
    puVar1->data = (void *)0x0;
  }
  ::cm::uv_handle_ptr_base_<uv_stream_s>::reset(&this_00->super_uv_handle_ptr_base_<uv_stream_s>);
  cmEventBasedConnection::OnConnectionShuttingDown(&this->super_cmEventBasedConnection);
  return true;
}

Assistant:

bool cmStdIoConnection::OnConnectionShuttingDown()
{
  if (ReadStream.get()) {
    uv_read_stop(ReadStream);
    ReadStream->data = nullptr;
  }

  this->ReadStream.reset();

  cmEventBasedConnection::OnConnectionShuttingDown();

  return true;
}